

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_masking.h
# Opt level: O0

void cio_websocket_mask(uint8_t *buffer,size_t length,uint8_t *mask)

{
  uint uVar1;
  long lVar2;
  uint8_t *local_68;
  size_t i_2;
  uint i_p;
  uint_fast8_t i_1;
  uint8_t *aligned_mask_filler;
  uint_fast32_t *buffer_aligned;
  ulong uStack_40;
  uint post_length;
  size_t main_length;
  ulong uStack_30;
  uint pre_length;
  size_t i;
  uint_fast32_t aligned_mask;
  uint8_t *mask_local;
  size_t length_local;
  uint8_t *buffer_local;
  
  i = 0;
  if (length < 8) {
    for (uStack_30 = 0; uStack_30 < length; uStack_30 = uStack_30 + 1) {
      buffer[uStack_30] = buffer[uStack_30] ^ mask[uStack_30 & 3];
    }
  }
  else {
    uVar1 = 8 - ((uint)buffer & 7) & 7;
    uStack_40 = length - uVar1 >> 3;
    lVar2 = uStack_40 << 3;
    aligned_mask_filler = buffer + uVar1;
    _i_p = &i;
    aligned_mask = (uint_fast32_t)mask;
    mask_local = (uint8_t *)length;
    length_local = (size_t)buffer;
    for (i_2._7_1_ = 0; i_2._7_1_ < 8; i_2._7_1_ = i_2._7_1_ + 1) {
      *(undefined1 *)_i_p = *(undefined1 *)(aligned_mask + (i_2._7_1_ + uVar1 & 3));
      _i_p = (size_t *)((long)_i_p + 1);
    }
    i_2._0_4_ = 0;
    main_length._4_4_ = uVar1;
    while (main_length._4_4_ != 0) {
      *(byte *)(length_local + (uint)i_2) =
           *(byte *)(length_local + (uint)i_2) ^ *(byte *)(aligned_mask + ((uint)i_2 & 3));
      i_2._0_4_ = (uint)i_2 + 1;
      main_length._4_4_ = main_length._4_4_ - 1;
    }
    while (uStack_40 != 0) {
      *(size_t *)aligned_mask_filler = i ^ *(ulong *)aligned_mask_filler;
      aligned_mask_filler = aligned_mask_filler + 8;
      uStack_40 = uStack_40 - 1;
    }
    for (local_68 = mask_local + -(ulong)(((int)length - uVar1) - (int)lVar2); local_68 < mask_local
        ; local_68 = local_68 + 1) {
      local_68[length_local] =
           local_68[length_local] ^ *(byte *)(aligned_mask + ((ulong)local_68 & 3));
    }
  }
  return;
}

Assistant:

static inline void cio_websocket_mask(uint8_t *buffer, size_t length, const uint8_t mask[4])
{
	uint_fast32_t aligned_mask = 0;

	if (length < sizeof(aligned_mask)) {
		for (size_t i = 0; i < length; i++) {
			buffer[i] = buffer[i] ^ (mask[i % 4]);
		}

		return;
	}

	unsigned int pre_length = ((uintptr_t)buffer) % sizeof(aligned_mask);
	pre_length = (sizeof(aligned_mask) - pre_length) % sizeof(aligned_mask);

	size_t main_length = (length - pre_length) / sizeof(aligned_mask);
	unsigned int post_length = (unsigned int)(length - pre_length - (main_length * sizeof(aligned_mask)));

	uint_fast32_t *buffer_aligned = (void *)(buffer + pre_length);

	uint8_t *aligned_mask_filler = (uint8_t *)&aligned_mask;
	for (uint_fast8_t i = 0; i < (uint_fast8_t)sizeof(aligned_mask); i++) {
		*aligned_mask_filler++ = mask[(i + pre_length) % 4];
	}

	unsigned int i_p = 0;
	while (pre_length-- > 0) {
		buffer[i_p] ^= (mask[i_p % 4]);
		i_p++;
	}

	while (main_length-- > 0) {
		*buffer_aligned ^= aligned_mask;
		buffer_aligned++;
	}

	for (size_t i = length - post_length; i < length; i++) {
		buffer[i] ^= (mask[i % 4]);
	}
}